

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void doWriteRead(pixels *p,string *filename,string *cppfilename,bool tiled,int xs,int ys,
                exr_compression_t comp,char *pattern)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  undefined8 uVar8;
  exr_compression_t extraout_var;
  byte in_CL;
  char *pcVar9;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  char *in_stack_00000010;
  exception *e_2;
  exception *e_1;
  exr_result_t _test_rv_16;
  exr_result_t _test_rv_15;
  exr_result_t _test_rv_14;
  exr_result_t _test_rv_13;
  pixels cpploadcpp;
  pixels cpploadc;
  pixels cpprestore;
  pixels restore;
  exception *e;
  exr_result_t _test_rv_12;
  exr_result_t _test_rv_11;
  exr_result_t _test_rv_10;
  exr_result_t _test_rv_9;
  int c;
  exr_result_t _test_rv_8;
  exr_result_t _test_rv_7;
  exr_result_t _test_rv_6;
  exr_result_t _test_rv_5;
  int zlev;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exr_attr_box2i_t dataW;
  exr_context_initializer_t cinit;
  int dwy;
  int dwx;
  int fh;
  int fw;
  int partidx;
  exr_context_t f;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  uint in_stack_fffffffffffffa14;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  pixels *in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  char *in_stack_fffffffffffffa40;
  pixels *in_stack_fffffffffffffa48;
  pixels *in_stack_fffffffffffffa50;
  pixels *in_stack_fffffffffffffa68;
  pixels *in_stack_fffffffffffffa70;
  ostream *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  exr_compression_t comp_00;
  pixels *in_stack_fffffffffffffb48;
  pixels *in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  pixels *in_stack_fffffffffffffcd8;
  exr_context_t in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  undefined1 tiled_00;
  pixels *in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  pixels *in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  exr_compression_t in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  int in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  string *in_stack_fffffffffffffd28;
  pixels *in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd58;
  int local_fc;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  undefined8 local_c0 [4];
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  undefined4 local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  byte local_29;
  
  local_29 = in_CL & 1;
  iVar1 = *in_RDI * in_R8D;
  iVar4 = in_RDI[1];
  iVar2 = in_R8D * 0x11;
  iVar3 = in_R9D * 0x1d;
  local_34 = in_R9D;
  local_30 = in_R8D;
  memset(local_c0,0,0x68);
  local_c0[0] = 0x68;
  exr_set_default_zip_compression_level(0xffffffff);
  local_c8 = iVar2 + iVar1 + -1;
  local_c4 = iVar3 + iVar4 * in_R9D + -1;
  local_d0 = iVar2;
  local_cc = iVar3;
  poVar7 = std::operator<<((ostream *)&std::cout,"  ");
  poVar7 = std::operator<<(poVar7,in_stack_00000010);
  poVar7 = std::operator<<(poVar7," tiled: ");
  pcVar9 = "no";
  if ((local_29 & 1) != 0) {
    pcVar9 = "yes";
  }
  poVar7 = std::operator<<(poVar7,pcVar9);
  poVar7 = std::operator<<(poVar7," sampling ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_30);
  poVar7 = std::operator<<(poVar7,", ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_34);
  poVar7 = std::operator<<(poVar7," comp ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000008);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  uVar8 = std::__cxx11::string::c_str();
  local_d4 = exr_start_write(&local_40,uVar8,0,local_c0);
  if (local_d4 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_d4);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(local_d4);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa14,
                   (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  }
  if ((local_29 & 1) == 0) {
    local_dc = exr_add_part(local_40,"scan",0,&local_44);
    if (local_dc != 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_dc);
      poVar7 = std::operator<<(poVar7,") ");
      pcVar9 = (char *)exr_get_default_error_message(local_dc);
      poVar7 = std::operator<<(poVar7,pcVar9);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                     (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                     in_stack_fffffffffffffa14,
                     (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    }
  }
  else {
    local_d8 = exr_add_part(local_40,"tiled",1,&local_44);
    if (local_d8 != 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_d8);
      poVar7 = std::operator<<(poVar7,") ");
      pcVar9 = (char *)exr_get_default_error_message(local_d8);
      poVar7 = std::operator<<(poVar7,pcVar9);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                     (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                     in_stack_fffffffffffffa14,
                     (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    }
  }
  local_e0 = exr_initialize_required_attr_simple
                       (local_40,local_44,iVar1,iVar4 * in_R9D,in_stack_00000008);
  if (local_e0 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_e0);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(local_e0);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa14,
                   (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  }
  local_e4 = exr_set_data_window(local_40,local_44,&local_d0);
  if (local_e4 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_e4);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(local_e4);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa14,
                   (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  }
  iVar4 = exr_get_zip_compression_level(local_40,local_44,&local_e8);
  if (iVar4 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar4);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa14,
                   (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  }
  if (local_e8 != 3) {
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa14,
                   (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  }
  iVar4 = exr_set_zip_compression_level(local_40,local_44,4);
  if (iVar4 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar4);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa14,
                   (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  }
  if (((local_29 & 1) != 0) &&
     (iVar4 = exr_set_tile_descriptor(local_40,local_44,0x20,0x20,0,1), iVar4 != 0)) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar4);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa14,
                   (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  }
  iVar4 = local_34;
  iVar5 = exr_add_channel(local_40,local_44,"I",0,0,local_30);
  if (iVar5 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar5);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa14,(char *)CONCAT44(in_stack_fffffffffffffa0c,iVar4));
  }
  for (local_fc = 0; comp_00 = (exr_compression_t)((ulong)in_stack_fffffffffffffb40 >> 0x20),
      local_fc < 5; local_fc = local_fc + 1) {
    iVar4 = local_34;
    iVar5 = exr_add_channel(local_40,local_44,channels[local_fc],1,0,local_30);
    if (iVar5 != 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
      poVar7 = std::operator<<(poVar7,") ");
      pcVar9 = (char *)exr_get_default_error_message(iVar5);
      poVar7 = std::operator<<(poVar7,pcVar9);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                     (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                     in_stack_fffffffffffffa14,(char *)CONCAT44(in_stack_fffffffffffffa0c,iVar4));
    }
  }
  iVar5 = exr_add_channel(local_40,local_44,"F",2,0,local_30);
  iVar4 = local_34;
  if (iVar5 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar5);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa14,(char *)CONCAT44(in_stack_fffffffffffffa0c,local_34));
    iVar4 = local_34;
  }
  iVar5 = exr_write_header(local_40);
  if (iVar5 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar5);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa14,(char *)CONCAT44(in_stack_fffffffffffffa0c,iVar4));
  }
  if ((local_29 & 1) == 0) {
    doEncodeScan(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
                 in_stack_fffffffffffffcd0);
  }
  else {
    doEncodeTile((exr_context_t)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffd00);
  }
  iVar5 = exr_finish(&local_40);
  if (iVar5 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar5);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                   in_stack_fffffffffffffa14,(char *)CONCAT44(in_stack_fffffffffffffa0c,iVar4));
  }
  iVar4 = iVar3;
  saveCPP(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,(bool)in_stack_fffffffffffffd27,
          in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18,
          in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,in_stack_fffffffffffffd50,
          in_stack_fffffffffffffd58);
  pcVar9 = getenv("ENABLE_EXACT_FILE_COMPARE");
  if (pcVar9 != (char *)0x0) {
    in_stack_fffffffffffffb48 = (pixels *)std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    iVar5 = compare_files(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (iVar5 != 0) {
      core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,iVar4),
                     (char *)CONCAT44(in_stack_fffffffffffffa1c,iVar2),in_stack_fffffffffffffa14,
                     (char *)CONCAT44(in_stack_fffffffffffffa0c,iVar1));
      goto LAB_00113b65;
    }
  }
  std::__cxx11::string::c_str();
  comp_00 = extraout_var;
  std::__cxx11::string::c_str();
  compare_files(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
LAB_00113b65:
  pixels::pixels(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  pixels::pixels(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  pixels::pixels(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  pixels::pixels(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  pixels::fillDead(in_stack_fffffffffffffa30);
  pixels::fillDead(in_stack_fffffffffffffa30);
  pixels::fillDead(in_stack_fffffffffffffa30);
  pixels::fillDead(in_stack_fffffffffffffa30);
  uVar8 = std::__cxx11::string::c_str();
  iVar6 = exr_start_read(&local_40,uVar8,local_c0);
  iVar5 = iVar6;
  if (iVar6 != 0) {
    in_stack_fffffffffffffb30 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffb30,iVar6);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar6);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,iVar4),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,iVar2),in_stack_fffffffffffffa14,
                   (char *)CONCAT44(in_stack_fffffffffffffa0c,iVar1));
  }
  if ((local_29 & 1) == 0) {
    doDecodeScan(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
                 in_stack_fffffffffffffcd0);
  }
  else {
    doDecodeTile((exr_context_t)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0);
  }
  iVar6 = exr_finish(&local_40);
  if (iVar6 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar6);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,iVar4),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,iVar2),in_stack_fffffffffffffa14,
                   (char *)CONCAT44(in_stack_fffffffffffffa0c,iVar1));
  }
  uVar8 = std::__cxx11::string::c_str();
  iVar6 = exr_start_read(&local_40,uVar8,local_c0);
  if (iVar6 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar6);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,iVar4),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,iVar2),in_stack_fffffffffffffa14,
                   (char *)CONCAT44(in_stack_fffffffffffffa0c,iVar1));
  }
  if ((local_29 & 1) == 0) {
    doDecodeScan(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
                 in_stack_fffffffffffffcd0);
    tiled_00 = (undefined1)((uint)in_stack_fffffffffffffcf4 >> 0x18);
  }
  else {
    doDecodeTile((exr_context_t)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0);
    tiled_00 = (undefined1)((uint)in_stack_fffffffffffffcf4 >> 0x18);
  }
  iVar6 = exr_finish(&local_40);
  if (iVar6 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
    poVar7 = std::operator<<(poVar7,") ");
    pcVar9 = (char *)exr_get_default_error_message(iVar6);
    poVar7 = std::operator<<(poVar7,pcVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,iVar4),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,iVar2),in_stack_fffffffffffffa14,
                   (char *)CONCAT44(in_stack_fffffffffffffa0c,iVar1));
  }
  loadCPP((pixels *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
          (string *)in_stack_fffffffffffffcf8,(bool)tiled_00,in_stack_fffffffffffffcf0,
          in_stack_fffffffffffffcec,in_stack_fffffffffffffce8,in_stack_fffffffffffffd10);
  loadCPP((pixels *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
          (string *)in_stack_fffffffffffffcf8,(bool)tiled_00,in_stack_fffffffffffffcf0,
          in_stack_fffffffffffffcec,in_stack_fffffffffffffce8,in_stack_fffffffffffffd10);
  if ((in_stack_00000008 != 8) && (in_stack_00000008 != 9)) {
    pixels::compareExact
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
               (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    pixels::compareExact
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
               (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    pixels::compareExact
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
               (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    pixels::compareExact
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
               (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  }
  if (in_stack_00000008 < 4) {
    pixels::compareExact
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
               (char *)CONCAT44(in_stack_00000008,in_stack_fffffffffffffa38));
  }
  else if (in_stack_00000008 - 4 < 6) {
    pixels::compareClose
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,comp_00,
               (char *)CONCAT44(iVar5,in_stack_fffffffffffffb38),(char *)in_stack_fffffffffffffb30);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Unknown compression type ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_stack_00000008);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(in_stack_fffffffffffffa24,iVar4),
                   (char *)CONCAT44(in_stack_fffffffffffffa1c,iVar2),in_stack_fffffffffffffa14,
                   (char *)CONCAT44(in_stack_fffffffffffffa0c,iVar3));
  }
  pcVar9 = (char *)std::__cxx11::string::c_str();
  remove(pcVar9);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  remove(pcVar9);
  pixels::~pixels((pixels *)CONCAT44(in_stack_fffffffffffffa24,iVar4));
  pixels::~pixels((pixels *)CONCAT44(in_stack_fffffffffffffa24,iVar4));
  pixels::~pixels((pixels *)CONCAT44(in_stack_fffffffffffffa24,iVar4));
  pixels::~pixels((pixels *)CONCAT44(in_stack_fffffffffffffa24,iVar4));
  return;
}

Assistant:

static void
doWriteRead (
    pixels&            p,
    const std::string& filename,
    const std::string& cppfilename,
    bool               tiled,
    int                xs,
    int                ys,
    exr_compression_t  comp,
    const char*        pattern)
{
    exr_context_t             f;
    int                       partidx;
    int                       fw    = p._w * xs;
    int                       fh    = p._h * ys;
    int                       dwx   = IMG_DATA_X * xs;
    int                       dwy   = IMG_DATA_Y * ys;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    exr_attr_box2i_t          dataW;

    exr_set_default_zip_compression_level (-1);
    cinit.zip_level = 3;
    cinit.flags |= EXR_CONTEXT_FLAG_WRITE_LEGACY_HEADER;

    dataW.min.x = dwx;
    dataW.min.y = dwy;
    dataW.max.x = dwx + fw - 1;
    dataW.max.y = dwy + fh - 1;

    std::cout << "  " << pattern << " tiled: " << (tiled ? "yes" : "no")
              << " sampling " << xs << ", " << ys << " comp " << (int) comp
              << std::endl;

    EXRCORE_TEST_RVAL (exr_start_write (
        &f, filename.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    if (tiled)
    {
        EXRCORE_TEST_RVAL (
            exr_add_part (f, "tiled", EXR_STORAGE_TILED, &partidx));
    }
    else
    {
        EXRCORE_TEST_RVAL (
            exr_add_part (f, "scan", EXR_STORAGE_SCANLINE, &partidx));
    }

    EXRCORE_TEST_RVAL (
        exr_initialize_required_attr_simple (f, partidx, fw, fh, comp));
    EXRCORE_TEST_RVAL (exr_set_data_window (f, partidx, &dataW));

    int zlev;
    EXRCORE_TEST_RVAL (exr_get_zip_compression_level (f, partidx, &zlev));
    EXRCORE_TEST (zlev == 3);
    EXRCORE_TEST_RVAL (exr_set_zip_compression_level (f, partidx, 4));
    if (tiled)
    {
        EXRCORE_TEST_RVAL (exr_set_tile_descriptor (
            f, partidx, 32, 32, EXR_TILE_ONE_LEVEL, EXR_TILE_ROUND_UP));
    }

    EXRCORE_TEST_RVAL (exr_add_channel (
        f, partidx, "I", EXR_PIXEL_UINT, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys));

    for (int c = 0; c < 5; ++c)
    {
        EXRCORE_TEST_RVAL (exr_add_channel (
            f,
            partidx,
            channels[c],
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            xs,
            ys));
    }
    EXRCORE_TEST_RVAL (exr_add_channel (
        f,
        partidx,
        "F",
        EXR_PIXEL_FLOAT,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        xs,
        ys));

    EXRCORE_TEST_RVAL (exr_write_header (f));
    if (tiled)
        doEncodeTile (f, p, xs, ys);
    else
        doEncodeScan (f, p, xs, ys);
    EXRCORE_TEST_RVAL (exr_finish (&f));

    try
    {
        saveCPP (p, cppfilename, tiled, xs, ys, comp, fw, fh, dwx, dwy);
    }
    catch (std::exception& e)
    {
        std::cerr << "ERROR saving " << cppfilename << ": " << e.what ()
                  << std::endl;
        EXRCORE_TEST_FAIL (saveCPP);
    }

#ifdef __linux
    if (getenv ("ENABLE_EXACT_FILE_COMPARE") &&
        0 != compare_files (filename.c_str(), cppfilename.c_str()))
    {
        EXRCORE_TEST_FAIL (compare_files);
    }
    else
    {
        compare_files (filename.c_str(), cppfilename.c_str());
    }
#endif
    pixels restore    = p;
    pixels cpprestore = p;
    pixels cpploadc   = p;
    pixels cpploadcpp = p;

    restore.fillDead ();
    cpprestore.fillDead ();
    cpploadc.fillDead ();
    cpploadcpp.fillDead ();

    EXRCORE_TEST_RVAL (exr_start_read (&f, filename.c_str (), &cinit));
    if (tiled)
        doDecodeTile (f, restore, xs, ys);
    else
        doDecodeScan (f, restore, xs, ys);
    EXRCORE_TEST_RVAL (exr_finish (&f));

    EXRCORE_TEST_RVAL (exr_start_read (&f, cppfilename.c_str (), &cinit));
    if (tiled)
        doDecodeTile (f, cpprestore, xs, ys);
    else
        doDecodeScan (f, cpprestore, xs, ys);
    EXRCORE_TEST_RVAL (exr_finish (&f));

    try
    {
        loadCPP (cpploadcpp, cppfilename, tiled, fw, fh, dwx, dwy);
    }
    catch (std::exception& e)
    {
        std::cerr << "ERROR loading " << cppfilename << ": " << e.what ()
                  << std::endl;
        EXRCORE_TEST_FAIL (loadCPP);
    }

    try
    {
        loadCPP (cpploadc, filename, tiled, fw, fh, dwx, dwy);
    }
    catch (std::exception& e)
    {
        std::cerr << "ERROR loading " << filename << ": " << e.what ()
                  << std::endl;
        EXRCORE_TEST_FAIL (loadCPP);
    }

    /* DWAA / DWAB seems to have some small number of ULP differences between C & C++ */
    if (comp != EXR_COMPRESSION_DWAA && comp != EXR_COMPRESSION_DWAB)
    {
        cpploadcpp.compareExact (cpploadc, "C++ loaded C", "C++ loaded C++");
        restore.compareExact (cpprestore, "C loaded C++", "C loaded C");
        restore.compareExact (cpploadc, "C++ loaded C", "C loaded C");
        restore.compareExact (cpploadcpp, "C++ loaded C++", "C loaded C");
    }

    switch (comp)
    {
        case EXR_COMPRESSION_NONE:
        case EXR_COMPRESSION_RLE:
        case EXR_COMPRESSION_ZIP:
        case EXR_COMPRESSION_ZIPS:
            restore.compareExact (p, "orig", "C loaded C");
            break;
        case EXR_COMPRESSION_PIZ:
        case EXR_COMPRESSION_PXR24:
        case EXR_COMPRESSION_B44:
        case EXR_COMPRESSION_B44A:
        case EXR_COMPRESSION_DWAA:
        case EXR_COMPRESSION_DWAB:
            restore.compareClose (p, comp, "orig", "C loaded C");
            break;
        case EXR_COMPRESSION_LAST_TYPE:
        default:
            std::cerr << "Unknown compression type " << (int) (comp)
                      << std::endl;
            EXRCORE_TEST (false);
            break;
    }
    remove (filename.c_str ());
    remove (cppfilename.c_str ());
}